

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&>::
~MatcherBase(MatcherBase<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&> *this)

{
  MatcherBase<const_std::pair<const_int,_phmap::priv::NonStandardLayout>_&> *this_local;
  
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_004479d0;
  Destroy(this);
  MatcherDescriberInterface::~MatcherDescriberInterface(&this->super_MatcherDescriberInterface);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }